

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::CompactHandler::processQuantity
          (CompactHandler *this,DecimalQuantity *quantity,MicroProps *micros,UErrorCode *status)

{
  UBool UVar1;
  bool bVar2;
  int32_t iVar3;
  MutablePatternModifier *local_f8;
  int local_dc;
  undefined1 local_d0 [56];
  UnicodeString local_98;
  ParsedPatternInfo *local_58;
  ParsedPatternInfo *patternInfo;
  CompactModInfo *info;
  UChar *pUStack_40;
  int32_t i;
  UChar *patternString;
  int32_t local_30;
  Form plural;
  int32_t multiplier;
  int32_t magnitude;
  UErrorCode *status_local;
  MicroProps *micros_local;
  DecimalQuantity *quantity_local;
  CompactHandler *this_local;
  
  _multiplier = status;
  status_local = (UErrorCode *)micros;
  micros_local = (MicroProps *)quantity;
  quantity_local = (DecimalQuantity *)this;
  (*this->parent->_vptr_MicroPropsGenerator[2])(this->parent,quantity,micros,status);
  UVar1 = ::U_FAILURE(*_multiplier);
  if (UVar1 == '\0') {
    bVar2 = DecimalQuantity::isZero((DecimalQuantity *)micros_local);
    if (bVar2) {
      plural = ZERO;
      RoundingImpl::apply((RoundingImpl *)(status_local + 2),(DecimalQuantity *)micros_local,
                          _multiplier);
    }
    else {
      local_30 = RoundingImpl::chooseMultiplierAndApply
                           ((RoundingImpl *)(status_local + 2),(DecimalQuantity *)micros_local,
                            &(this->data).super_MultiplierProducer,_multiplier);
      bVar2 = DecimalQuantity::isZero((DecimalQuantity *)micros_local);
      if (bVar2) {
        local_dc = 0;
      }
      else {
        local_dc = DecimalQuantity::getMagnitude((DecimalQuantity *)micros_local);
      }
      plural = local_dc - local_30;
    }
    patternString._4_4_ = utils::getStandardPlural(this->rules,(IFixedDecimal *)micros_local);
    pUStack_40 = CompactData::getPattern(&this->data,plural,patternString._4_4_);
    if (pUStack_40 != (UChar *)0x0) {
      if (this->safe == '\0') {
        local_58 = &this->unsafePatternInfo;
        UnicodeString::UnicodeString(&local_98,pUStack_40);
        PatternParser::parseToPatternInfo(&local_98,local_58,_multiplier);
        UnicodeString::~UnicodeString(&local_98);
        if (*(undefined8 *)(status_local + 0x1c) == U_ZERO_ERROR) {
          local_f8 = (MutablePatternModifier *)0x0;
        }
        else {
          local_f8 = (MutablePatternModifier *)
                     (*(undefined8 *)(status_local + 0x1c) - U_INDEX_OUTOFBOUNDS_ERROR);
        }
        MutablePatternModifier::setPatternInfo(local_f8,&local_58->super_AffixPatternProvider);
      }
      else {
        for (info._4_4_ = 0; info._4_4_ < this->precomputedModsLength; info._4_4_ = info._4_4_ + 1)
        {
          patternInfo = (ParsedPatternInfo *)
                        MaybeStackArray<icu_63::number::impl::CompactModInfo,_12>::operator[]
                                  (&this->precomputedMods,(long)info._4_4_);
          iVar3 = u_strcmp_63(pUStack_40,
                              (UChar *)(patternInfo->pattern).super_Replaceable.super_UObject.
                                       _vptr_UObject);
          if (iVar3 == 0) {
            ImmutablePatternModifier::applyToMicros
                      ((ImmutablePatternModifier *)
                       (patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider,
                       (MicroProps *)status_local,(DecimalQuantity *)micros_local);
            break;
          }
        }
      }
    }
    RoundingImpl::passThrough();
    memcpy(status_local + 2,local_d0,0x25);
  }
  return;
}

Assistant:

void CompactHandler::processQuantity(DecimalQuantity &quantity, MicroProps &micros,
                                     UErrorCode &status) const {
    parent->processQuantity(quantity, micros, status);
    if (U_FAILURE(status)) { return; }

    // Treat zero as if it had magnitude 0
    int32_t magnitude;
    if (quantity.isZero()) {
        magnitude = 0;
        micros.rounder.apply(quantity, status);
    } else {
        // TODO: Revisit chooseMultiplierAndApply
        int32_t multiplier = micros.rounder.chooseMultiplierAndApply(quantity, data, status);
        magnitude = quantity.isZero() ? 0 : quantity.getMagnitude();
        magnitude -= multiplier;
    }

    StandardPlural::Form plural = utils::getStandardPlural(rules, quantity);
    const UChar *patternString = data.getPattern(magnitude, plural);
    if (patternString == nullptr) {
        // Use the default (non-compact) modifier.
        // No need to take any action.
    } else if (safe) {
        // Safe code path.
        // Java uses a hash set here for O(1) lookup.  C++ uses a linear search.
        // TODO: Benchmark this and maybe change to a binary search or hash table.
        int32_t i = 0;
        for (; i < precomputedModsLength; i++) {
            const CompactModInfo &info = precomputedMods[i];
            if (u_strcmp(patternString, info.patternString) == 0) {
                info.mod->applyToMicros(micros, quantity);
                break;
            }
        }
        // It should be guaranteed that we found the entry.
        U_ASSERT(i < precomputedModsLength);
    } else {
        // Unsafe code path.
        // Overwrite the PatternInfo in the existing modMiddle.
        // C++ Note: Use unsafePatternInfo for proper lifecycle.
        ParsedPatternInfo &patternInfo = const_cast<CompactHandler *>(this)->unsafePatternInfo;
        PatternParser::parseToPatternInfo(UnicodeString(patternString), patternInfo, status);
        static_cast<MutablePatternModifier*>(const_cast<Modifier*>(micros.modMiddle))
            ->setPatternInfo(&patternInfo);
    }

    // We already performed rounding. Do not perform it again.
    micros.rounder = RoundingImpl::passThrough();
}